

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnMemoryInitExpr
          (BinaryReaderIR *this,Index segment,Index memidx)

{
  char *pcVar1;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aVar2;
  Result RVar3;
  MemoryVarExpr<(wabt::ExprType)32> *this_00;
  Location loc_1;
  Location loc;
  _Head_base<0UL,_wabt::Expr_*,_false> local_170;
  Location local_168;
  Location local_148;
  Location local_128;
  Var local_108;
  Var local_c0;
  Var local_78;
  
  pcVar1 = this->filename_;
  aVar2.offset = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_128.field_1.field_0.last_column = 0;
  local_128.filename._M_len = strlen(pcVar1);
  local_128.filename._M_str = pcVar1;
  local_128.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)aVar2.offset;
  Var::Var(&local_c0,segment,&local_128);
  pcVar1 = this->filename_;
  aVar2.offset = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_148.field_1.field_0.last_column = 0;
  local_148.filename._M_len = strlen(pcVar1);
  local_148.filename._M_str = pcVar1;
  local_148.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)aVar2.offset;
  Var::Var(&local_108,memidx,&local_148);
  this_00 = (MemoryVarExpr<(wabt::ExprType)32> *)operator_new(0xd0);
  Var::Var(&local_78,&local_108);
  local_168.field_1.field_0.line = 0;
  local_168.field_1._4_8_ = 0;
  local_168.filename._M_len = 0;
  local_168.filename._M_str._0_4_ = 0;
  local_168.filename._M_str._4_4_ = 0;
  MemoryVarExpr<(wabt::ExprType)32>::MemoryVarExpr(this_00,&local_c0,&local_78,&local_168);
  Var::~Var(&local_78);
  local_170._M_head_impl = (Expr *)this_00;
  RVar3 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_170);
  if ((MemoryVarExpr<(wabt::ExprType)32> *)local_170._M_head_impl !=
      (MemoryVarExpr<(wabt::ExprType)32> *)0x0) {
    (*(((MemoryExpr<(wabt::ExprType)32> *)&(local_170._M_head_impl)->_vptr_Expr)->
      super_ExprMixin<(wabt::ExprType)32>).super_Expr._vptr_Expr[1])();
  }
  Var::~Var(&local_108);
  Var::~Var(&local_c0);
  return (Result)RVar3.enum_;
}

Assistant:

Result BinaryReaderIR::OnMemoryInitExpr(Index segment, Index memidx) {
  return AppendExpr(std::make_unique<MemoryInitExpr>(
      Var(segment, GetLocation()), Var(memidx, GetLocation())));
}